

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::EnhancedLayouts::XFBGetProgramResourceAPITest::testCase
          (XFBGetProgramResourceAPITest *this,GLuint test_case_index)

{
  CASES CVar1;
  bool bVar2;
  GLuint GVar3;
  uint uVar4;
  pointer ptVar5;
  allocator<char> local_17a;
  allocator<char> local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  NameVector captured_varyings;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  Program program;
  string local_50;
  
  getShaderSource_abi_cxx11_(&local_e0,this,test_case_index,GEOMETRY);
  program.m_compute.m_context = (this->super_TestBase).super_TestCase.m_context;
  program.m_id = 0;
  program.m_compute.m_id = 0;
  program.m_fragment.m_id = 0;
  program.m_geometry.m_id = 0;
  program.m_tess_ctrl.m_id = 0;
  program.m_tess_eval.m_id = 0;
  program.m_vertex.m_id = 0;
  program.m_fragment.m_context = program.m_compute.m_context;
  program.m_geometry.m_context = program.m_compute.m_context;
  program.m_tess_ctrl.m_context = program.m_compute.m_context;
  program.m_tess_eval.m_context = program.m_compute.m_context;
  program.m_vertex.m_context = program.m_compute.m_context;
  program.m_context = program.m_compute.m_context;
  getShaderSource_abi_cxx11_(&local_100,this,test_case_index,TESS_CTRL);
  getShaderSource_abi_cxx11_(&local_120,this,test_case_index,TESS_EVAL);
  ptVar5 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::XFBGetProgramResourceAPITest::test_Case,_std::allocator<gl4cts::EnhancedLayouts::XFBGetProgramResourceAPITest::test_Case>_>
           ._M_impl.super__Vector_impl_data._M_start + test_case_index;
  getShaderSource_abi_cxx11_(&local_50,this,test_case_index,VERTEX);
  CVar1 = ptVar5->m_case;
  if (CVar1 == SEPARATED) {
    captured_varyings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    captured_varyings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    captured_varyings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"b0_v0",(allocator<char> *)&local_140);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &captured_varyings,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"b0_v1",(allocator<char> *)&local_140);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &captured_varyings,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"b0_v3",(allocator<char> *)&local_140);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &captured_varyings,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"b1_v1",(allocator<char> *)&local_140);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &captured_varyings,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,glcts::fixed_sample_locations_values + 1,&local_17a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,glcts::fixed_sample_locations_values + 1,&local_179);
    Utils::Program::Init
              (&program,&local_178,&local_140,&local_e0,&local_100,&local_120,&local_50,
               &captured_varyings,false,true);
  }
  else {
    if (CVar1 != INTERLEAVED) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&captured_varyings);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,glcts::fixed_sample_locations_values + 1,&local_17a);
      Utils::Program::Init
                (&program,&local_178,&local_140,&local_e0,&local_100,&local_120,&local_50,true);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_178);
      goto LAB_009717fe;
    }
    captured_varyings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    captured_varyings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    captured_varyings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"b0_v0",(allocator<char> *)&local_140);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &captured_varyings,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"b0_v1",(allocator<char> *)&local_140);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &captured_varyings,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    GVar3 = Utils::Type::GetSize(&ptVar5->m_type);
    uVar4 = GVar3 >> 2;
    (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[9])
              (this,(ulong)uVar4,&captured_varyings);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"b0_v3",(allocator<char> *)&local_140);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &captured_varyings,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"gl_NextBuffer",(allocator<char> *)&local_140);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &captured_varyings,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[9])
              (this,(ulong)uVar4,&captured_varyings);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"b1_v1",(allocator<char> *)&local_140);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &captured_varyings,&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[9])
              (this,(ulong)(uVar4 * 2),&captured_varyings);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,glcts::fixed_sample_locations_values + 1,&local_17a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,glcts::fixed_sample_locations_values + 1,&local_179);
    Utils::Program::Init
              (&program,&local_178,&local_140,&local_e0,&local_100,&local_120,&local_50,
               &captured_varyings,true,true);
  }
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_178);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&captured_varyings);
LAB_009717fe:
  bVar2 = inspectProgram(this,test_case_index,&program);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  Utils::Program::~Program(&program);
  std::__cxx11::string::~string((string *)&local_e0);
  return bVar2;
}

Assistant:

bool XFBGetProgramResourceAPITest::testCase(GLuint test_case_index)
{
	const std::string& gs_source = getShaderSource(test_case_index, Utils::Shader::GEOMETRY);
	Utils::Program	 program(m_context);
	const std::string& tcs_source		= getShaderSource(test_case_index, Utils::Shader::TESS_CTRL);
	const std::string& tes_source		= getShaderSource(test_case_index, Utils::Shader::TESS_EVAL);
	const test_Case&   test_case		= m_test_cases[test_case_index];
	bool			   test_case_result = true;
	const std::string& vs_source		= getShaderSource(test_case_index, Utils::Shader::VERTEX);

	// According to spec: gl_SkipComponents1 ~ gl_SkipComponents4 is treated as specifying a one- to four-component floating point output variables with undefined values.
	// No data will be recorded for such strings, but the offset assigned to the next variable in varyings and the stride of the assigned bingding point will be affected.

	if (INTERLEAVED == test_case.m_case)
	{
		/*
		 layout (xfb_buffer = 0, xfb_offset = 1 * type_size) out type b0_v1;
		 layout (xfb_buffer = 1, xfb_offset = 1 * type_size) out type b1_v1;
		 layout (xfb_buffer = 0, xfb_offset = 3 * type_size) out type b0_v3;
		 layout (xfb_buffer = 0, xfb_offset = 0 * type_size) out type b0_v0;

		 Note: the type can be float, double, mat2, mat3x2, dmat2, dmat3x2..., so to make the each variable of "captured_varyings" has the same xfb_offset with the above shaders,
		 we need to calculate how many "gl_SkipComponents" need to be inserted.
		 */
		Utils::Program::NameVector captured_varyings;
		captured_varyings.push_back("b0_v0");
		captured_varyings.push_back("b0_v1");
		// Compute how many gl_SkipComponents to be inserted
		int numComponents = test_case.m_type.GetSize() / 4;
		insertSkipComponents(numComponents, captured_varyings);
		captured_varyings.push_back("b0_v3");
		captured_varyings.push_back("gl_NextBuffer");
		insertSkipComponents(numComponents, captured_varyings);
		captured_varyings.push_back("b1_v1");
		insertSkipComponents(numComponents * 2, captured_varyings);

		program.Init("" /* cs */, "", gs_source, tcs_source, tes_source, vs_source, captured_varyings, true,
					 true /* separable */);
	}
	else if (SEPARATED == test_case.m_case)
	{
		Utils::Program::NameVector captured_varyings;

		captured_varyings.push_back("b0_v0");
		captured_varyings.push_back("b0_v1");
		captured_varyings.push_back("b0_v3");
		captured_varyings.push_back("b1_v1");

		program.Init("" /* cs */, "", gs_source, tcs_source, tes_source, vs_source, captured_varyings, false,
					 true /* separable */);
	}
	else
	{

		program.Init("" /* cs */, "", gs_source, tcs_source, tes_source, vs_source, true /* separable */);
	}

	test_case_result = inspectProgram(test_case_index, program);

	return test_case_result;
}